

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void promise_reaction_data_free(JSRuntime *rt,JSPromiseReactionData *rd)

{
  JS_FreeValueRT(rt,rd->resolving_funcs[0]);
  JS_FreeValueRT(rt,rd->resolving_funcs[1]);
  JS_FreeValueRT(rt,rd->handler);
  (*(rt->mf).js_free)(&rt->malloc_state,rd);
  return;
}

Assistant:

static void promise_reaction_data_free(JSRuntime *rt,
                                       JSPromiseReactionData *rd)
{
    JS_FreeValueRT(rt, rd->resolving_funcs[0]);
    JS_FreeValueRT(rt, rd->resolving_funcs[1]);
    JS_FreeValueRT(rt, rd->handler);
    js_free_rt(rt, rd);
}